

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table_filter.cpp
# Opt level: O1

void __thiscall
duckdb::DynamicTableFilterSet::PushFilter
          (DynamicTableFilterSet *this,PhysicalOperator *op,idx_t column_index,
          unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true> *filter)

{
  idx_t iVar1;
  int iVar2;
  __node_base_ptr p_Var3;
  _Hash_node_base *p_Var4;
  __uniq_ptr_impl<duckdb::TableFilterSet,_std::default_delete<duckdb::TableFilterSet>_> *this_00;
  _Rb_tree_header *p_Var5;
  __hash_code __code;
  optional_ptr<duckdb::TableFilterSet,_true> filter_ptr;
  templated_unique_single_t filter_set;
  _Head_base<0UL,_duckdb::TableFilter_*,_false> local_60;
  optional_ptr<duckdb::TableFilterSet,_true> local_58;
  ColumnIndex local_50;
  key_type local_30;
  
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)this);
  if (iVar2 == 0) {
    local_50.index = (idx_t)op;
    p_Var3 = ::std::
             _Hashtable<std::reference_wrapper<const_duckdb::PhysicalOperator>,_std::pair<const_std::reference_wrapper<const_duckdb::PhysicalOperator>,_duckdb::unique_ptr<duckdb::TableFilterSet,_std::default_delete<duckdb::TableFilterSet>,_true>_>,_std::allocator<std::pair<const_std::reference_wrapper<const_duckdb::PhysicalOperator>,_duckdb::unique_ptr<duckdb::TableFilterSet,_std::default_delete<duckdb::TableFilterSet>,_true>_>_>,_std::__detail::_Select1st,_duckdb::ReferenceEquality<const_duckdb::PhysicalOperator>,_duckdb::ReferenceHashFunction<const_duckdb::PhysicalOperator>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
             ::_M_find_before_node
                       (&(this->filters)._M_h,(ulong)op % (this->filters)._M_h._M_bucket_count,
                        (key_type *)&local_50,(__hash_code)op);
    if (p_Var3 == (__node_base_ptr)0x0) {
      p_Var4 = (_Hash_node_base *)0x0;
    }
    else {
      p_Var4 = p_Var3->_M_nxt;
    }
    local_58.ptr = (TableFilterSet *)0x0;
    if (p_Var4 == (_Hash_node_base *)0x0) {
      local_58.ptr = (TableFilterSet *)operator_new(0x30);
      p_Var5 = &((local_58.ptr)->filters)._M_t._M_impl.super__Rb_tree_header;
      ((local_58.ptr)->filters)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
           (_Base_ptr)0x0;
      ((local_58.ptr)->filters)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           (_Base_ptr)0x0;
      ((local_58.ptr)->filters)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           (_Base_ptr)0x0;
      ((local_58.ptr)->filters)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      *(_Hash_node_base **)&((local_58.ptr)->filters)._M_t._M_impl = (_Hash_node_base *)0x0;
      *(undefined8 *)&((local_58.ptr)->filters)._M_t._M_impl.super__Rb_tree_header._M_header = 0;
      ((local_58.ptr)->filters)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &p_Var5->_M_header;
      ((local_58.ptr)->filters)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           &p_Var5->_M_header;
      ((local_58.ptr)->filters)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      local_50.index = (idx_t)local_58.ptr;
      local_30._M_data = op;
      this_00 = (__uniq_ptr_impl<duckdb::TableFilterSet,_std::default_delete<duckdb::TableFilterSet>_>
                 *)::std::__detail::
                   _Map_base<std::reference_wrapper<const_duckdb::PhysicalOperator>,_std::pair<const_std::reference_wrapper<const_duckdb::PhysicalOperator>,_duckdb::unique_ptr<duckdb::TableFilterSet,_std::default_delete<duckdb::TableFilterSet>,_true>_>,_std::allocator<std::pair<const_std::reference_wrapper<const_duckdb::PhysicalOperator>,_duckdb::unique_ptr<duckdb::TableFilterSet,_std::default_delete<duckdb::TableFilterSet>,_true>_>_>,_std::__detail::_Select1st,_duckdb::ReferenceEquality<const_duckdb::PhysicalOperator>,_duckdb::ReferenceHashFunction<const_duckdb::PhysicalOperator>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                   ::operator[]((_Map_base<std::reference_wrapper<const_duckdb::PhysicalOperator>,_std::pair<const_std::reference_wrapper<const_duckdb::PhysicalOperator>,_duckdb::unique_ptr<duckdb::TableFilterSet,_std::default_delete<duckdb::TableFilterSet>,_true>_>,_std::allocator<std::pair<const_std::reference_wrapper<const_duckdb::PhysicalOperator>,_duckdb::unique_ptr<duckdb::TableFilterSet,_std::default_delete<duckdb::TableFilterSet>,_true>_>_>,_std::__detail::_Select1st,_duckdb::ReferenceEquality<const_duckdb::PhysicalOperator>,_duckdb::ReferenceHashFunction<const_duckdb::PhysicalOperator>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                 *)&this->filters,&local_30);
      iVar1 = local_50.index;
      local_50.index = 0;
      ::std::__uniq_ptr_impl<duckdb::TableFilterSet,_std::default_delete<duckdb::TableFilterSet>_>::
      reset(this_00,(pointer)iVar1);
      iVar1 = local_50.index;
      if ((PhysicalOperator *)local_50.index != (PhysicalOperator *)0x0) {
        ::std::
        _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>_>,_std::_Select1st<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>_>_>_>
        ::~_Rb_tree((_Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>_>,_std::_Select1st<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>_>_>_>
                     *)local_50.index);
        operator_delete((void *)iVar1);
      }
    }
    else {
      local_58.ptr = (TableFilterSet *)p_Var4[2]._M_nxt;
    }
    optional_ptr<duckdb::TableFilterSet,_true>::CheckValid(&local_58);
    local_50.child_indexes.super_vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>.
    super__Vector_base<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_50.child_indexes.super_vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>.
    super__Vector_base<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_50.child_indexes.super_vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>.
    super__Vector_base<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_60._M_head_impl =
         (filter->super_unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>_>).
         _M_t.super___uniq_ptr_impl<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>_>.
         _M_t.
         super__Tuple_impl<0UL,_duckdb::TableFilter_*,_std::default_delete<duckdb::TableFilter>_>.
         super__Head_base<0UL,_duckdb::TableFilter_*,_false>._M_head_impl;
    (filter->super_unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>_>)._M_t.
    super___uniq_ptr_impl<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::TableFilter_*,_std::default_delete<duckdb::TableFilter>_>.
    super__Head_base<0UL,_duckdb::TableFilter_*,_false>._M_head_impl = (TableFilter *)0x0;
    local_50.index = column_index;
    TableFilterSet::PushFilter
              (local_58.ptr,&local_50,
               (unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true> *)
               &local_60);
    if (local_60._M_head_impl != (TableFilter *)0x0) {
      (*(local_60._M_head_impl)->_vptr_TableFilter[1])();
    }
    local_60._M_head_impl = (TableFilter *)0x0;
    ::std::vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>::~vector
              (&local_50.child_indexes.
                super_vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>);
    pthread_mutex_unlock((pthread_mutex_t *)this);
    return;
  }
  ::std::__throw_system_error(iVar2);
}

Assistant:

void DynamicTableFilterSet::PushFilter(const PhysicalOperator &op, idx_t column_index, unique_ptr<TableFilter> filter) {
	lock_guard<mutex> l(lock);
	auto entry = filters.find(op);
	optional_ptr<TableFilterSet> filter_ptr;
	if (entry == filters.end()) {
		auto filter_set = make_uniq<TableFilterSet>();
		filter_ptr = filter_set.get();
		filters[op] = std::move(filter_set);
	} else {
		filter_ptr = entry->second.get();
	}
	filter_ptr->PushFilter(ColumnIndex(column_index), std::move(filter));
}